

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,decimal_fp<float> *f,format_specs *specs,sign s,locale_ref loc)

{
  uint uVar1;
  uint uVar2;
  undefined8 it;
  int iVar3;
  long lVar4;
  basic_appender<char> bVar5;
  int **ppiVar6;
  int iVar7;
  ulong uVar8;
  bool *pbVar9;
  ulong uVar10;
  bool *pbVar11;
  char *pcVar12;
  int iVar13;
  buffer<char> *buf;
  byte bVar14;
  int iVar15;
  char cVar16;
  undefined8 uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  size_t sVar21;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_8_ce6b8c4d write;
  int num_zeros;
  undefined1 local_de [2];
  bool local_dc [12];
  int local_d0;
  undefined1 local_cc [20];
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  format_specs *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int *local_60;
  undefined1 *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  uVar18 = f->significand;
  uVar2 = 0x1f;
  if ((uVar18 | 1) != 0) {
    for (; (uVar18 | 1) >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  lVar20 = *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar2 * 8);
  iVar7 = (int)((ulong)uVar18 + lVar20 >> 0x20);
  uVar10 = (ulong)((iVar7 + 1) - (uint)(s == none));
  local_de[1] = '0';
  uVar2 = (specs->super_basic_specs).data_;
  local_de[0] = '.';
  local_dc._4_8_ = out.container;
  local_d0 = iVar7;
  local_cc._0_4_ = uVar18;
  local_cc._4_4_ = s;
  if ((uVar2 >> 0xe & 1) != 0) {
    local_cc._12_8_ = uVar10;
    local_de[0] = decimal_point_impl<char>(loc);
    uVar2 = (specs->super_basic_specs).data_;
    uVar10 = local_cc._12_8_;
  }
  uVar17 = local_a8._M_allocated_capacity;
  it = local_dc._4_8_;
  uVar1 = f->exponent;
  iVar13 = uVar1 + iVar7;
  iVar3 = specs->precision;
  bVar14 = (byte)uVar2 & 7;
  if (bVar14 == 1) {
LAB_00207b32:
    iVar15 = uVar1 + iVar7 + -1;
    if ((uVar2 >> 0xd & 1) == 0) {
      uVar8 = 0;
      if (iVar7 == 1) {
        local_de[0] = '\0';
        uVar8 = 0;
      }
    }
    else {
      uVar8 = 0;
      if (0 < iVar3 - iVar7) {
        uVar8 = (ulong)(uint)(iVar3 - iVar7);
      }
      uVar10 = uVar10 + uVar8;
    }
    iVar3 = 1 - iVar13;
    if (0 < iVar13) {
      iVar3 = iVar15;
    }
    lVar20 = 2;
    if (99 < iVar3) {
      lVar20 = (ulong)(999 < iVar3) + 3;
    }
    sVar21 = (3 - (ulong)(local_de[0] == '\0')) + uVar10 + lVar20;
    local_b8._4_4_ = uVar18;
    local_b8._0_4_ = s;
    local_b8[0xc] = local_de[0];
    local_b8._8_4_ = iVar7;
    local_a8._M_allocated_capacity._0_5_ = CONCAT14('0',(int)uVar8);
    local_a8._M_allocated_capacity._6_2_ = SUB82(uVar17,6);
    local_a8._M_allocated_capacity =
         CONCAT26(local_a8._M_allocated_capacity._6_2_,
                  CONCAT15(((uVar2 >> 0xc & 1) == 0) << 5,local_a8._M_allocated_capacity._0_5_)) |
         0x450000000000;
    local_a8._8_4_ = iVar15;
    if (0 < specs->width) {
      bVar5 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                        ((basic_appender<char>)local_dc._4_8_,specs,sVar21,sVar21,
                         (anon_class_28_8_ce6b8c4d *)local_b8);
      return (basic_appender<char>)bVar5.container;
    }
    uVar10 = sVar21 + *(size_t *)(local_dc._4_8_ + 8);
    if (*(size_t *)(local_dc._4_8_ + 0x10) < uVar10) {
      (**(grow_fun *)(local_dc._4_8_ + 0x18))((buffer<char> *)local_dc._4_8_,uVar10);
    }
    bVar5 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<float>,_fmt::v11::detail::digit_grouping<char>_>
            ::anon_class_28_8_ce6b8c4d::operator()
                      ((anon_class_28_8_ce6b8c4d *)local_b8,(iterator)it);
    return (basic_appender<char>)bVar5.container;
  }
  if ((uVar2 & 7) != 2) {
    iVar15 = 0x10;
    if (0 < iVar3) {
      iVar15 = iVar3;
    }
    if ((iVar13 < -3) || (iVar15 < iVar13)) goto LAB_00207b32;
  }
  local_cc._8_4_ = iVar13;
  if (-1 < (int)uVar1) {
    lVar20 = uVar10 + uVar1;
    local_dc._0_4_ = iVar3 - iVar13;
    if ((uVar2 >> 0xd & 1) != 0) {
      lVar20 = lVar20 + 1;
      if (((int)local_dc._0_4_ < 1) && (bVar14 != 2)) {
        local_dc[0] = false;
        local_dc[1] = false;
        local_dc[2] = false;
        local_dc[3] = false;
      }
      else if (0 < (int)local_dc._0_4_) {
        lVar20 = lVar20 + (ulong)(uint)local_dc._0_4_;
      }
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar2 >> 0xe) & 1));
    iVar7 = 0;
    if (local_48 != (digit_grouping<char> *)0x0) {
      pcVar12 = (char *)(local_70._8_8_ + local_70._0_8_);
      lVar4 = 0;
      uVar17 = local_70._0_8_;
      do {
        if ((char *)uVar17 == pcVar12) {
          cVar16 = pcVar12[-1];
          uVar17 = pcVar12;
        }
        else {
          cVar16 = *(char *)uVar17;
          if ((byte)(cVar16 + 0x81U) < 0x82) goto LAB_00207d3e;
          uVar17 = (char *)(uVar17 + 1);
        }
        iVar7 = iVar7 + cVar16;
        if (iVar13 <= iVar7) goto LAB_00207d3e;
        lVar4 = lVar4 + 1;
      } while( true );
    }
    lVar4 = 0;
LAB_00207d3e:
    local_b8._0_8_ = local_cc + 4;
    local_b8._8_8_ = local_cc;
    local_a8._M_allocated_capacity = (size_type)&local_d0;
    local_88._M_allocated_capacity = (size_type)local_de;
    local_88._8_8_ = local_dc;
    local_78 = local_de + 1;
    local_a8._8_8_ = f;
    local_98._M_p = (pointer)&local_70;
    local_90 = specs;
    bVar5 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_&>
                      ((basic_appender<char>)it,specs,lVar20 + lVar4,lVar20 + lVar4,
                       (anon_class_72_9_eb40e20e *)local_b8);
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    ppiVar6 = &local_60;
LAB_00207e64:
    if ((int **)ppiVar6[-2] != ppiVar6) {
      operator_delete(ppiVar6[-2]);
    }
    return (basic_appender<char>)bVar5.container;
  }
  if (0 < iVar13) {
    uVar19 = 0;
    local_dc._0_4_ = iVar3 - iVar7 & (int)(uVar2 << 0x12) >> 0x1f;
    uVar8 = (ulong)(uint)local_dc._0_4_;
    if ((int)local_dc._0_4_ < 1) {
      uVar8 = uVar19;
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)local_b8,loc,(bool)((byte)(uVar2 >> 0xe) & 1));
    if (local_90 != (format_specs *)0x0) {
      pbVar9 = (bool *)(local_b8._8_8_ + local_b8._0_8_);
      lVar20 = 0;
      pbVar11 = (bool *)local_b8._0_8_;
      do {
        if (pbVar11 == pbVar9) {
          cVar16 = pbVar9[-1];
          pbVar11 = pbVar9;
        }
        else {
          cVar16 = *pbVar11;
          if ((byte)(cVar16 + 0x81U) < 0x82) goto LAB_00207def;
          pbVar11 = pbVar11 + 1;
        }
        uVar18 = (int)uVar19 + (int)cVar16;
        uVar19 = (ulong)uVar18;
        if (iVar13 <= (int)uVar18) goto LAB_00207def;
        lVar20 = lVar20 + 1;
      } while( true );
    }
    lVar20 = 0;
LAB_00207def:
    sVar21 = uVar8 + uVar10 + 1 + lVar20;
    local_70._M_allocated_capacity = (size_type)(local_cc + 4);
    local_70._8_8_ = local_cc;
    local_60 = &local_d0;
    local_58 = local_cc + 8;
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_de;
    local_40._M_allocated_capacity = (size_type)local_dc;
    local_40._8_8_ = local_de + 1;
    local_48 = (digit_grouping<char> *)local_b8;
    bVar5 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_&>
                      ((basic_appender<char>)local_dc._4_8_,specs,sVar21,sVar21,
                       (anon_class_64_8_085c650e *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p);
    }
    ppiVar6 = (int **)(local_b8 + 0x10);
    goto LAB_00207e64;
  }
  iVar7 = -iVar13;
  local_70._M_allocated_capacity._0_4_ = iVar7;
  if ((ulong)uVar18 + lVar20 >> 0x20 == 0) {
    if ((-1 < iVar3) && (SBORROW4(iVar3,iVar7) != iVar3 + iVar13 < 0)) {
      local_70._M_allocated_capacity._0_4_ = iVar3;
      iVar7 = iVar3;
    }
    if (iVar7 == 0) {
      local_dc[0] = (bool)(char)((uVar2 & 0x2000) >> 0xd);
      iVar3 = 2 - (uint)((uVar2 & 0x2000) == 0);
      iVar7 = 0;
      goto LAB_00207e8e;
    }
  }
  local_dc[0] = true;
  iVar3 = 2;
LAB_00207e8e:
  sVar21 = uVar10 + (uint)(iVar7 + iVar3);
  local_b8._0_8_ = local_cc + 4;
  local_b8._8_8_ = local_dc;
  local_a8._M_allocated_capacity = (size_type)local_de;
  local_a8._8_8_ = &local_70;
  local_98._M_p = local_de + 1;
  local_90 = (format_specs *)local_cc;
  local_88._M_allocated_capacity = (size_type)&local_d0;
  bVar5 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_&>
                    ((basic_appender<char>)local_dc._4_8_,specs,sVar21,sVar21,
                     (anon_class_56_7_88befd79 *)local_b8);
  return (basic_appender<char>)bVar5.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}